

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

CImg<unsigned_char> * __thiscall
cimg_library::CImgList<unsigned_char>::get_append
          (CImg<unsigned_char> *__return_storage_ptr__,CImgList<unsigned_char> *this,char axis,
          float align)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  CImg<unsigned_char> *pCVar4;
  void *pvVar5;
  char cVar6;
  int iVar7;
  long lVar8;
  CImg<unsigned_char> *pCVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  int l;
  long lVar14;
  int l_2;
  uint uVar15;
  uchar local_4c [4];
  CImg<unsigned_char> *local_48;
  CImgList<unsigned_char> *local_40;
  float local_34;
  
  pCVar9 = this->_data;
  uVar11 = this->_width;
  if (uVar11 == 0 || pCVar9 == (CImg<unsigned_char> *)0x0) {
    __return_storage_ptr__->_data = (uchar *)0x0;
    __return_storage_ptr__->_width = 0;
    __return_storage_ptr__->_height = 0;
    __return_storage_ptr__->_depth = 0;
    __return_storage_ptr__->_spectrum = 0;
    __return_storage_ptr__->_is_shared = false;
  }
  else {
    uVar12 = (ulong)uVar11;
    local_40 = this;
    local_34 = align;
    if (uVar11 == 1) {
      CImg<unsigned_char>::CImg(__return_storage_ptr__,pCVar9,false);
    }
    else {
      __return_storage_ptr__->_data = (uchar *)0x0;
      __return_storage_ptr__->_width = 0;
      __return_storage_ptr__->_height = 0;
      __return_storage_ptr__->_depth = 0;
      __return_storage_ptr__->_spectrum = 0;
      __return_storage_ptr__->_is_shared = false;
      cVar6 = axis + ' ';
      if ((byte)(axis + 0xa5U) < 0xe6) {
        cVar6 = axis;
      }
      local_48 = __return_storage_ptr__;
      if (cVar6 == 'x') {
        if ((int)uVar11 < 1) {
          uVar10 = 0;
          uVar13 = 0;
          uVar11 = 0;
          uVar15 = 0;
        }
        else {
          lVar8 = 0;
          uVar15 = 0;
          uVar11 = 0;
          uVar13 = 0;
          uVar10 = 0;
          do {
            if (*(long *)((long)&pCVar9->_data + lVar8) != 0) {
              uVar10 = uVar10 + *(int *)((long)&pCVar9->_width + lVar8);
              uVar1 = *(uint *)((long)&pCVar9->_height + lVar8);
              uVar2 = *(uint *)((long)&pCVar9->_depth + lVar8);
              if (uVar13 <= uVar1) {
                uVar13 = uVar1;
              }
              if (uVar11 <= uVar2) {
                uVar11 = uVar2;
              }
              uVar1 = *(uint *)((long)&pCVar9->_spectrum + lVar8);
              if (uVar15 <= uVar1) {
                uVar15 = uVar1;
              }
            }
            lVar8 = lVar8 + 0x20;
          } while (uVar12 << 5 != lVar8);
        }
        local_4c[3] = 0;
        pCVar9 = CImg<unsigned_char>::assign(__return_storage_ptr__,uVar10,uVar13,uVar11,uVar15);
        CImg<unsigned_char>::fill(pCVar9,local_4c + 3);
        __return_storage_ptr__ = local_48;
        if ((local_48->_data != (uchar *)0x0) && (0 < (int)local_40->_width)) {
          lVar8 = 0;
          lVar14 = 0;
          uVar12 = 0;
          do {
            pCVar4 = local_40->_data;
            pCVar9 = (CImg<unsigned_char> *)((long)&pCVar4->_width + lVar8);
            pvVar5 = *(void **)((long)&pCVar4->_data + lVar8);
            if (pvVar5 != (void *)0x0) {
              iVar3 = *(int *)((long)&pCVar4->_height + lVar8);
              iVar7 = *(int *)((long)&pCVar4->_depth + lVar8);
              if ((((iVar3 == 1) && (iVar7 == 1)) &&
                  (iVar7 = 1, *(int *)((long)&pCVar4->_spectrum + lVar8) == 1)) &&
                 (((local_48->_height == 1 && (local_48->_depth == 1)) && (local_48->_spectrum == 1)
                  ))) {
                memcpy(local_48->_data + uVar12,pvVar5,(ulong)pCVar9->_width);
              }
              else {
                CImg<unsigned_char>::draw_image
                          (local_48,(int)uVar12,(int)((float)(uVar13 - iVar3) * local_34),
                           (int)((float)(uVar11 - iVar7) * local_34),
                           (int)((float)(uVar15 - *(int *)((long)&pCVar4->_spectrum + lVar8)) *
                                local_34),pCVar9,1.0);
              }
            }
            uVar12 = (ulong)((int)uVar12 + pCVar9->_width);
            lVar14 = lVar14 + 1;
            lVar8 = lVar8 + 0x20;
            __return_storage_ptr__ = local_48;
          } while (lVar14 < (int)local_40->_width);
        }
      }
      else if (cVar6 == 'y') {
        if ((int)uVar11 < 1) {
          uVar11 = 0;
          uVar10 = 0;
          uVar13 = 0;
          uVar15 = 0;
        }
        else {
          lVar8 = 0;
          uVar15 = 0;
          uVar13 = 0;
          uVar10 = 0;
          uVar11 = 0;
          do {
            if (*(long *)((long)&pCVar9->_data + lVar8) != 0) {
              uVar1 = *(uint *)((long)&pCVar9->_width + lVar8);
              if (uVar11 <= uVar1) {
                uVar11 = uVar1;
              }
              uVar1 = *(uint *)((long)&pCVar9->_depth + lVar8);
              uVar10 = uVar10 + *(int *)((long)&pCVar9->_height + lVar8);
              if (uVar13 <= uVar1) {
                uVar13 = uVar1;
              }
              uVar1 = *(uint *)((long)&pCVar9->_spectrum + lVar8);
              if (uVar15 <= uVar1) {
                uVar15 = uVar1;
              }
            }
            lVar8 = lVar8 + 0x20;
          } while (uVar12 << 5 != lVar8);
        }
        local_4c[2] = 0;
        pCVar9 = CImg<unsigned_char>::assign(__return_storage_ptr__,uVar11,uVar10,uVar13,uVar15);
        CImg<unsigned_char>::fill(pCVar9,local_4c + 2);
        __return_storage_ptr__ = local_48;
        if ((local_48->_data != (uchar *)0x0) && (0 < (int)local_40->_width)) {
          lVar8 = 0;
          lVar14 = 0;
          uVar12 = 0;
          do {
            pCVar9 = local_40->_data;
            pvVar5 = *(void **)((long)&pCVar9->_data + lVar8);
            if (pvVar5 != (void *)0x0) {
              iVar3 = *(int *)((long)&pCVar9->_width + lVar8);
              iVar7 = *(int *)((long)&pCVar9->_depth + lVar8);
              if ((((iVar7 == 1 && iVar3 == 1) &&
                   (iVar7 = 1, *(int *)((long)&pCVar9->_spectrum + lVar8) == 1)) &&
                  (local_48->_width == 1)) &&
                 ((local_48->_depth == 1 && (local_48->_spectrum == 1)))) {
                memcpy(local_48->_data + uVar12,pvVar5,
                       (ulong)*(uint *)((long)&pCVar9->_height + lVar8));
              }
              else {
                CImg<unsigned_char>::draw_image
                          (local_48,(int)((float)(uVar11 - iVar3) * local_34),(int)uVar12,
                           (int)((float)(uVar13 - iVar7) * local_34),
                           (int)((float)(uVar15 - *(int *)((long)&pCVar9->_spectrum + lVar8)) *
                                local_34),(CImg<unsigned_char> *)((long)&pCVar9->_width + lVar8),1.0
                          );
              }
            }
            uVar12 = (ulong)(uint)((int)uVar12 + *(int *)((long)&pCVar9->_height + lVar8));
            lVar14 = lVar14 + 1;
            lVar8 = lVar8 + 0x20;
            __return_storage_ptr__ = local_48;
          } while (lVar14 < (int)local_40->_width);
        }
      }
      else if (cVar6 == 'z') {
        if ((int)uVar11 < 1) {
          uVar11 = 0;
          uVar13 = 0;
          uVar10 = 0;
          uVar15 = 0;
        }
        else {
          lVar8 = 0;
          uVar15 = 0;
          uVar10 = 0;
          uVar13 = 0;
          uVar11 = 0;
          do {
            if (*(long *)((long)&pCVar9->_data + lVar8) != 0) {
              uVar1 = *(uint *)((long)&pCVar9->_width + lVar8);
              uVar2 = *(uint *)((long)&pCVar9->_height + lVar8);
              if (uVar11 <= uVar1) {
                uVar11 = uVar1;
              }
              if (uVar13 <= uVar2) {
                uVar13 = uVar2;
              }
              uVar10 = uVar10 + *(int *)((long)&pCVar9->_depth + lVar8);
              uVar1 = *(uint *)((long)&pCVar9->_spectrum + lVar8);
              if (uVar15 <= uVar1) {
                uVar15 = uVar1;
              }
            }
            lVar8 = lVar8 + 0x20;
          } while (uVar12 << 5 != lVar8);
        }
        local_4c[1] = 0;
        pCVar9 = CImg<unsigned_char>::assign(__return_storage_ptr__,uVar11,uVar13,uVar10,uVar15);
        CImg<unsigned_char>::fill(pCVar9,local_4c + 1);
        __return_storage_ptr__ = local_48;
        if ((local_48->_data != (uchar *)0x0) && (0 < (int)local_40->_width)) {
          lVar8 = 0;
          lVar14 = 0;
          uVar12 = 0;
          do {
            pCVar9 = local_40->_data;
            pvVar5 = *(void **)((long)&pCVar9->_data + lVar8);
            if (pvVar5 != (void *)0x0) {
              iVar3 = *(int *)((long)&pCVar9->_width + lVar8);
              iVar7 = *(int *)((long)&pCVar9->_height + lVar8);
              if ((((iVar7 == 1 && iVar3 == 1) &&
                   (iVar7 = 1, *(int *)((long)&pCVar9->_spectrum + lVar8) == 1)) &&
                  (local_48->_width == 1)) &&
                 ((local_48->_height == 1 && (local_48->_spectrum == 1)))) {
                memcpy(local_48->_data + uVar12,pvVar5,
                       (ulong)*(uint *)((long)&pCVar9->_depth + lVar8));
              }
              else {
                CImg<unsigned_char>::draw_image
                          (local_48,(int)((float)(uVar11 - iVar3) * local_34),
                           (int)((float)(uVar13 - iVar7) * local_34),(int)uVar12,
                           (int)((float)(uVar15 - *(int *)((long)&pCVar9->_spectrum + lVar8)) *
                                local_34),(CImg<unsigned_char> *)((long)&pCVar9->_width + lVar8),1.0
                          );
              }
            }
            uVar12 = (ulong)(uint)((int)uVar12 + *(int *)((long)&pCVar9->_depth + lVar8));
            lVar14 = lVar14 + 1;
            lVar8 = lVar8 + 0x20;
            __return_storage_ptr__ = local_48;
          } while (lVar14 < (int)local_40->_width);
        }
      }
      else {
        if ((int)uVar11 < 1) {
          uVar11 = 0;
          uVar13 = 0;
          uVar15 = 0;
          uVar10 = 0;
        }
        else {
          lVar8 = 0;
          uVar10 = 0;
          uVar15 = 0;
          uVar13 = 0;
          uVar11 = 0;
          do {
            if (*(long *)((long)&pCVar9->_data + lVar8) != 0) {
              uVar1 = *(uint *)((long)&pCVar9->_width + lVar8);
              uVar2 = *(uint *)((long)&pCVar9->_height + lVar8);
              if (uVar11 <= uVar1) {
                uVar11 = uVar1;
              }
              if (uVar13 <= uVar2) {
                uVar13 = uVar2;
              }
              uVar1 = *(uint *)((long)&pCVar9->_depth + lVar8);
              if (uVar15 <= uVar1) {
                uVar15 = uVar1;
              }
              uVar10 = uVar10 + *(int *)((long)&pCVar9->_spectrum + lVar8);
            }
            lVar8 = lVar8 + 0x20;
          } while (uVar12 << 5 != lVar8);
        }
        local_4c[0] = '\0';
        pCVar9 = CImg<unsigned_char>::assign(__return_storage_ptr__,uVar11,uVar13,uVar15,uVar10);
        CImg<unsigned_char>::fill(pCVar9,local_4c);
        __return_storage_ptr__ = local_48;
        if ((local_48->_data != (uchar *)0x0) && (0 < (int)local_40->_width)) {
          lVar8 = 0;
          lVar14 = 0;
          uVar12 = 0;
          do {
            pCVar9 = local_40->_data;
            pvVar5 = *(void **)((long)&pCVar9->_data + lVar8);
            if (pvVar5 != (void *)0x0) {
              iVar3 = *(int *)((long)&pCVar9->_width + lVar8);
              iVar7 = *(int *)((long)&pCVar9->_height + lVar8);
              if ((((iVar7 == 1 && iVar3 == 1) &&
                   (iVar7 = 1, *(int *)((long)&pCVar9->_depth + lVar8) == 1)) &&
                  (local_48->_width == 1)) && ((local_48->_height == 1 && (local_48->_depth == 1))))
              {
                memcpy(local_48->_data + uVar12,pvVar5,
                       (ulong)*(uint *)((long)&pCVar9->_spectrum + lVar8));
              }
              else {
                CImg<unsigned_char>::draw_image
                          (local_48,(int)((float)(uVar11 - iVar3) * local_34),
                           (int)((float)(uVar13 - iVar7) * local_34),
                           (int)((float)(uVar15 - *(int *)((long)&pCVar9->_depth + lVar8)) *
                                local_34),(int)uVar12,
                           (CImg<unsigned_char> *)((long)&pCVar9->_width + lVar8),1.0);
              }
            }
            uVar12 = (ulong)(uint)((int)uVar12 + *(int *)((long)&pCVar9->_spectrum + lVar8));
            lVar14 = lVar14 + 1;
            lVar8 = lVar8 + 0x20;
            __return_storage_ptr__ = local_48;
          } while (lVar14 < (int)local_40->_width);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

CImg<T> get_append(const char axis, const float align=0) const {
      if (is_empty()) return CImg<T>();
      if (_width==1) return +((*this)[0]);
      unsigned int dx = 0, dy = 0, dz = 0, dc = 0, pos = 0;
      CImg<T> res;
      switch (cimg::lowercase(axis)) {
      case 'x' : { // Along the X-axis
        cimglist_for(*this,l) {
          const CImg<T>& img = (*this)[l];
          if (img) {
            dx+=img._width;
            dy = std::max(dy,img._height);
            dz = std::max(dz,img._depth);
            dc = std::max(dc,img._spectrum);
          }
        }
        res.assign(dx,dy,dz,dc,(T)0);
        if (res) cimglist_for(*this,l) {
            const CImg<T>& img = (*this)[l];
            if (img) {
              if (img._height==1 && img._depth==1 && img._spectrum==1 &&
                  res._height==1 && res._depth==1 && res._spectrum==1)
                std::memcpy(&res[pos],img._data,sizeof(T)*img._width);
              else
                res.draw_image(pos,
                               (int)(align*(dy - img._height)),
                               (int)(align*(dz - img._depth)),
                               (int)(align*(dc - img._spectrum)),
                               img);
            }
            pos+=img._width;
          }
      } break;
      case 'y' : { // Along the Y-axis
        cimglist_for(*this,l) {
          const CImg<T>& img = (*this)[l];
          if (img) {
            dx = std::max(dx,img._width);
            dy+=img._height;
            dz = std::max(dz,img._depth);
            dc = std::max(dc,img._spectrum);
          }
        }
        res.assign(dx,dy,dz,dc,(T)0);
        if (res) cimglist_for(*this,l) {
            const CImg<T>& img = (*this)[l];
            if (img) {
              if (img._width==1 && img._depth==1 && img._spectrum==1 &&
                  res._width==1 && res._depth==1 && res._spectrum==1)
                std::memcpy(&res[pos],img._data,sizeof(T)*img._height);
              else
                res.draw_image((int)(align*(dx - img._width)),
                               pos,
                               (int)(align*(dz - img._depth)),
                               (int)(align*(dc - img._spectrum)),
                               img);
            }
            pos+=img._height;
          }
      } break;
      case 'z' : { // Along the Z-axis
        cimglist_for(*this,l) {
          const CImg<T>& img = (*this)[l];
          if (img) {
            dx = std::max(dx,img._width);
            dy = std::max(dy,img._height);
            dz+=img._depth;
            dc = std::max(dc,img._spectrum);
          }
        }
        res.assign(dx,dy,dz,dc,(T)0);
        if (res) cimglist_for(*this,l) {
            const CImg<T>& img = (*this)[l];
            if (img) {
              if (img._width==1 && img._height==1 && img._spectrum==1 &&
                  res._width==1 && res._height==1 && res._spectrum==1)
                std::memcpy(&res[pos],img._data,sizeof(T)*img._depth);
              else
                res.draw_image((int)(align*(dx - img._width)),
                               (int)(align*(dy - img._height)),
                               pos,
                               (int)(align*(dc - img._spectrum)),
                               img);
            }
            pos+=img._depth;
          }
      } break;
      default : { // Along the C-axis
        cimglist_for(*this,l) {
          const CImg<T>& img = (*this)[l];
          if (img) {
            dx = std::max(dx,img._width);
            dy = std::max(dy,img._height);
            dz = std::max(dz,img._depth);
            dc+=img._spectrum;
          }
        }
        res.assign(dx,dy,dz,dc,(T)0);
        if (res) cimglist_for(*this,l) {
            const CImg<T>& img = (*this)[l];
            if (img) {
              if (img._width==1 && img._height==1 && img._depth==1 &&
                  res._width==1 && res._height==1 && res._depth==1)
                std::memcpy(&res[pos],img._data,sizeof(T)*img._spectrum);
              else
                res.draw_image((int)(align*(dx - img._width)),
                               (int)(align*(dy - img._height)),
                               (int)(align*(dz - img._depth)),
                               pos,
                               img);
            }
            pos+=img._spectrum;
          }
      }
      }
      return res;
    }